

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall
jpgd::jpeg_decoder::decode_scan(jpeg_decoder *this,pDecode_block_func decode_block_func)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int block_y_mcu [4];
  int block_x_mcu [4];
  int local_68 [6];
  pDecode_block_func local_50;
  int local_48 [6];
  
  local_50 = decode_block_func;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  iVar5 = 0;
  do {
    if (this->m_mcus_per_col <= iVar5) {
      return;
    }
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    for (iVar3 = 0; iVar3 < this->m_mcus_per_row; iVar3 = iVar3 + 1) {
      if ((this->m_restart_interval != 0) && (this->m_restarts_left == 0)) {
        process_restart(this);
      }
      iVar4 = 0;
      iVar9 = 0;
      for (lVar10 = 0; lVar10 < this->m_blocks_per_mcu; lVar10 = lVar10 + 1) {
        iVar1 = this->m_mcu_org[lVar10];
        iVar8 = local_48[iVar1];
        (*local_50)(this,iVar1,iVar8 + iVar4,local_68[iVar1] + iVar9);
        if (this->m_comps_in_scan == 1) {
          iVar8 = iVar8 + 1;
LAB_001b145f:
          local_48[iVar1] = iVar8;
        }
        else {
          iVar11 = iVar4 + 1;
          iVar4 = iVar11;
          if (iVar11 == this->m_comp_h_samp[iVar1]) {
            iVar9 = iVar9 + 1;
            iVar4 = 0;
            if (iVar9 == this->m_comp_v_samp[iVar1]) {
              iVar8 = iVar11 + iVar8;
              iVar9 = 0;
              iVar4 = 0;
              goto LAB_001b145f;
            }
          }
        }
      }
      this->m_restarts_left = this->m_restarts_left + -1;
    }
    uVar2 = this->m_comps_in_scan;
    if (uVar2 == 1) {
      local_68[this->m_comp_list[0]] = local_68[this->m_comp_list[0]] + 1;
    }
    else {
      uVar6 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar6 = 0;
      }
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        local_68[this->m_comp_list[uVar7]] =
             local_68[this->m_comp_list[uVar7]] + this->m_comp_v_samp[this->m_comp_list[uVar7]];
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void jpeg_decoder::decode_scan(pDecode_block_func decode_block_func)
	{
		int mcu_row, mcu_col, mcu_block;
		int block_x_mcu[JPGD_MAX_COMPONENTS], block_y_mcu[JPGD_MAX_COMPONENTS];

		memset(block_y_mcu, 0, sizeof(block_y_mcu));

		for (mcu_col = 0; mcu_col < m_mcus_per_col; mcu_col++)
		{
			int component_num, component_id;

			memset(block_x_mcu, 0, sizeof(block_x_mcu));

			for (mcu_row = 0; mcu_row < m_mcus_per_row; mcu_row++)
			{
				int block_x_mcu_ofs = 0, block_y_mcu_ofs = 0;

				if ((m_restart_interval) && (m_restarts_left == 0))
					process_restart();

				for (mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++)
				{
					component_id = m_mcu_org[mcu_block];

					decode_block_func(this, component_id, block_x_mcu[component_id] + block_x_mcu_ofs, block_y_mcu[component_id] + block_y_mcu_ofs);

					if (m_comps_in_scan == 1)
						block_x_mcu[component_id]++;
					else
					{
						if (++block_x_mcu_ofs == m_comp_h_samp[component_id])
						{
							block_x_mcu_ofs = 0;

							if (++block_y_mcu_ofs == m_comp_v_samp[component_id])
							{
								block_y_mcu_ofs = 0;
								block_x_mcu[component_id] += m_comp_h_samp[component_id];
							}
						}
					}
				}

				m_restarts_left--;
			}

			if (m_comps_in_scan == 1)
				block_y_mcu[m_comp_list[0]]++;
			else
			{
				for (component_num = 0; component_num < m_comps_in_scan; component_num++)
				{
					component_id = m_comp_list[component_num];
					block_y_mcu[component_id] += m_comp_v_samp[component_id];
				}
			}
		}
	}